

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool ON_Font::EqualStretch(ON_Font *lhs,ON_Font *rhs,bool bUnsetIsEqual)

{
  if (rhs != (ON_Font *)0x0 && lhs != (ON_Font *)0x0) {
    if ((lhs->m_font_stretch == rhs->m_font_stretch) ||
       ((bUnsetIsEqual && (lhs->m_font_stretch == Unset || rhs->m_font_stretch == Unset)))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_Font::EqualStretch(
  const ON_Font* lhs,
  const ON_Font* rhs,
  bool bUnsetIsEqual
)
{
  if (nullptr == lhs || nullptr == rhs)
    return false;
  if (lhs->m_font_stretch != rhs->m_font_stretch)
  {
    if (false == bUnsetIsEqual)
      return false;
    if (ON_Font::Stretch::Unset != lhs->m_font_stretch && ON_Font::Stretch::Unset != rhs->m_font_stretch)
      return false;
  }
  return true;
}